

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O1

void __thiscall
Imf_3_2::PizCompressor::PizCompressor
          (PizCompressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ChannelList *pCVar6;
  unsigned_short *puVar7;
  char *pcVar8;
  const_iterator cVar9;
  ConstIterator CVar10;
  ChannelData *pCVar11;
  Box2i *pBVar12;
  OverflowExc *pOVar13;
  bool bVar14;
  ulong uVar15;
  
  Compressor::Compressor(&this->super_Compressor,hdr);
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__PizCompressor_003d7ec0;
  this->_maxScanLineSize = (int)maxScanLineSize;
  this->_format = XDR;
  this->_numScanLines = (int)numScanLines;
  this->_tmpBuffer = (unsigned_short *)0x0;
  this->_outBuffer = (char *)0x0;
  this->_numChans = 0;
  pCVar6 = Header::channels(hdr);
  this->_channels = pCVar6;
  this->_channelData = (ChannelData *)0x0;
  if ((maxScanLineSize != 0) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = maxScanLineSize, auVar3._8_8_ = 0,
     auVar3._0_8_ = numScanLines, SUB168(auVar1 * auVar3,8) != 0)) {
    pOVar13 = (OverflowExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::OverflowExc::OverflowExc(pOVar13,"Integer multiplication overflow.");
    __cxa_throw(pOVar13,&Iex_3_2::OverflowExc::typeinfo,Iex_3_2::OverflowExc::~OverflowExc);
  }
  if ((maxScanLineSize == 0) ||
     (auVar2._8_8_ = 0, auVar2._0_8_ = maxScanLineSize, auVar4._8_8_ = 0,
     auVar4._0_8_ = numScanLines, SUB168(auVar2 * auVar4,8) == 0)) {
    uVar15 = numScanLines * maxScanLineSize;
    if (uVar15 < 0xfffffffffffee000) {
      puVar7 = (unsigned_short *)operator_new__(uVar15 & 0xfffffffffffffffe);
      this->_tmpBuffer = puVar7;
      pcVar8 = (char *)operator_new__(uVar15 + 0x12000);
      this->_outBuffer = pcVar8;
      pCVar6 = Header::channels((this->super_Compressor)._header);
      cVar9._M_node = (_Base_ptr)ChannelList::begin(pCVar6);
      bVar14 = true;
      while( true ) {
        CVar10 = ChannelList::end(pCVar6);
        iVar5 = this->_numChans;
        if ((const_iterator)cVar9._M_node == CVar10._i._M_node) break;
        this->_numChans = iVar5 + 1;
        if (cVar9._M_node[9]._M_color != _S_black) {
          bVar14 = false;
        }
        cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node);
      }
      uVar15 = 0xffffffffffffffff;
      if (-1 < iVar5) {
        uVar15 = (long)iVar5 << 5;
      }
      pCVar11 = (ChannelData *)operator_new__(uVar15);
      this->_channelData = pCVar11;
      pBVar12 = Header::dataWindow(hdr);
      this->_minX = (pBVar12->min).x;
      iVar5 = (pBVar12->max).y;
      this->_maxX = (pBVar12->max).x;
      this->_maxY = iVar5;
      if (bVar14) {
        iVar5 = pixelTypeSize(HALF);
        if (iVar5 == 2) {
          this->_format = NATIVE;
        }
      }
      return;
    }
    pOVar13 = (OverflowExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::OverflowExc::OverflowExc(pOVar13,"Integer addition overflow.");
  }
  else {
    pOVar13 = (OverflowExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::OverflowExc::OverflowExc(pOVar13,"Integer multiplication overflow.");
  }
  __cxa_throw(pOVar13,&Iex_3_2::OverflowExc::typeinfo,Iex_3_2::OverflowExc::~OverflowExc);
}

Assistant:

PizCompressor::PizCompressor (
    const Header& hdr, size_t maxScanLineSize, size_t numScanLines)
    : Compressor (hdr)
    , _maxScanLineSize (maxScanLineSize)
    , _format (XDR)
    , _numScanLines (numScanLines)
    , _tmpBuffer (0)
    , _outBuffer (0)
    , _numChans (0)
    , _channels (hdr.channels ())
    , _channelData (0)
{
    // TODO: Remove this when we can change the ABI
    (void) _maxScanLineSize;
    size_t tmpBufferSize = uiMult (maxScanLineSize, numScanLines) / 2;

    size_t outBufferSize =
        uiAdd (uiMult (maxScanLineSize, numScanLines), size_t (65536 + 8192));

    _tmpBuffer = new unsigned short[checkArraySize (
        tmpBufferSize, sizeof (unsigned short))];

    _outBuffer = new char[outBufferSize];

    const ChannelList& channels         = header ().channels ();
    bool               onlyHalfChannels = true;

    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c)
    {
        _numChans++;

        assert (pixelTypeSize (c.channel ().type) % pixelTypeSize (HALF) == 0);

        if (c.channel ().type != HALF) onlyHalfChannels = false;
    }

    _channelData = new ChannelData[_numChans];

    const Box2i& dataWindow = hdr.dataWindow ();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;

    //
    // We can support uncompressed data in the machine's native format
    // if all image channels are of type HALF, and if the Xdr and the
    // native representations of a half have the same size.
    //

    if (onlyHalfChannels && (sizeof (half) == pixelTypeSize (HALF)))
        _format = NATIVE;
}